

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O0

void ec2AddLD(word *c,word *a,word *b,ec_o *ec,void *stack)

{
  long lVar1;
  bool_t bVar2;
  int iVar3;
  size_t *c_00;
  size_t *psVar4;
  long in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *t6;
  word *t5;
  word *t4;
  word *t3;
  word *t2;
  word *t1;
  size_t n;
  size_t *c_01;
  ec_o *ec_00;
  word *a_00;
  word *b_00;
  
  lVar1 = *(long *)(*(long *)(in_RCX + 0x18) + 0x30);
  b_00 = in_R8 + lVar1;
  a_00 = b_00 + lVar1;
  ec_00 = (ec_o *)(a_00 + lVar1);
  c_01 = &(ec_00->hdr).keep + lVar1;
  c_00 = c_01 + lVar1;
  psVar4 = c_00 + lVar1;
  bVar2 = wwIsZero(in_RSI + lVar1 * 2,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
  if (bVar2 == 0) {
    bVar2 = wwIsZero(in_RDX + lVar1 * 2,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
    if (bVar2 == 0) {
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (in_R8,in_RSI,in_RDX + lVar1 * 2,*(undefined8 *)(in_RCX + 0x18),psVar4);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (b_00,in_RDX,in_RSI + lVar1 * 2,*(undefined8 *)(in_RCX + 0x18),psVar4);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                (a_00,in_RDX + lVar1 * 2,*(undefined8 *)(in_RCX + 0x18),psVar4);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (a_00,a_00,in_RSI + lVar1,*(undefined8 *)(in_RCX + 0x18),psVar4);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                (ec_00,in_RSI + lVar1 * 2,*(undefined8 *)(in_RCX + 0x18),psVar4);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (ec_00,ec_00,in_RDX + lVar1,*(undefined8 *)(in_RCX + 0x18),psVar4);
      iVar3 = wwCmp(in_R8,b_00,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
      if (iVar3 == 0) {
        iVar3 = wwCmp(a_00,(word *)ec_00,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        if (iVar3 == 0) {
          ec2DblLD(b_00,a_00,ec_00,c_01);
        }
        else {
          wwSetZero(in_RDI + lVar1 * 2,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        }
      }
      else {
        wwXor(c_01,in_R8,b_00,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        wwXor(c_00,a_00,(word *)ec_00,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (c_01,c_01,c_00,*(undefined8 *)(in_RCX + 0x18),psVar4);
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                  (in_RDI,in_R8,*(undefined8 *)(in_RCX + 0x18),psVar4);
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                  (in_RDI + lVar1,b_00,*(undefined8 *)(in_RCX + 0x18),psVar4);
        wwXor(c_00,in_RDI,in_RDI + lVar1,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (in_RDI + lVar1 * 2,in_RSI + lVar1 * 2,in_RDX + lVar1 * 2,
                   *(undefined8 *)(in_RCX + 0x18),psVar4);
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (in_RDI + lVar1 * 2,c_00,in_RDI + lVar1 * 2,*(undefined8 *)(in_RCX + 0x18),psVar4)
        ;
        wwXor2((word *)ec_00,in_RDI + lVar1,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (ec_00,in_R8,ec_00,*(undefined8 *)(in_RCX + 0x18),psVar4);
        wwXor2(in_RDI,a_00,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (in_RDI,b_00,in_RDI,*(undefined8 *)(in_RCX + 0x18),psVar4);
        wwXor2(in_RDI,(word *)ec_00,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (in_R8,in_R8,c_01,*(undefined8 *)(in_RCX + 0x18),psVar4);
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (a_00,a_00,c_00,*(undefined8 *)(in_RCX + 0x18),psVar4);
        wwXor2(in_R8,a_00,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (in_R8,in_R8,c_00,*(undefined8 *)(in_RCX + 0x18),psVar4);
        wwXor(in_RDI + lVar1,c_01,in_RDI + lVar1 * 2,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (in_RDI + lVar1,in_RDI + lVar1,in_RDI,*(undefined8 *)(in_RCX + 0x18),psVar4);
        wwXor2(in_RDI + lVar1,in_R8,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
      }
    }
    else {
      wwCopy(in_RDI,in_RSI,lVar1 * 3);
    }
  }
  else {
    wwCopy(in_RDI,in_RDX,lVar1 * 3);
  }
  return;
}

Assistant:

static void ec2AddLD(word c[], const word a[], const word b[],
	const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	word* t4 = t3 + n;
	word* t5 = t4 + n;
	word* t6 = t5 + n;
	stack = t6 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ec2SeemsOn3(a, ec));
	ASSERT(ec2SeemsOn3(b, ec));
	ASSERT(wwIsSameOrDisjoint(a, c, 3 * n));
	ASSERT(wwIsSameOrDisjoint(b, c, 3 * n));
	// a == O => c <- b
	if (qrIsZero(ecZ(a, n), ec->f))
	{
		wwCopy(c, b, 3 * n);
		return;
	}
	// b == O => c <- a
	if (qrIsZero(ecZ(b, n), ec->f))
	{
		wwCopy(c, a, 3 * n);
		return;
	}
	// t1 <- xa zb [A]
	qrMul(t1, ecX(a), ecZ(b, n), ec->f, stack);
	// t2 <- xb za [B]
	qrMul(t2, ecX(b), ecZ(a, n), ec->f, stack);
	// t3 <- ya zb^2 [G]
	qrSqr(t3, ecZ(b, n), ec->f, stack);
	qrMul(t3, t3, ecY(a, n), ec->f, stack);
	// t4 <- yb za^2 [H]
	qrSqr(t4, ecZ(a, n), ec->f, stack);
	qrMul(t4, t4, ecY(b, n), ec->f, stack);
	// A == B => a == \pm b
	if (qrCmp(t1, t2, ec->f) == 0)
	{
		// t3 == t4 => a == b => c <- 2a
		if (qrCmp(t3, t4, ec->f) == 0)
			ec2DblLD(c, a, ec, stack);
		// t3 != t4 => a == -b => c <- O
		else
			qrSetZero(ecZ(c, n), ec->f);
		return;
	}
	// t5 <- t1 + t2 [E]
	gf2Add(t5, t1, t2, ec->f);
	// t6 <- t3 + t4 [I]
	gf2Add(t6, t3, t4, ec->f);
	// t5 <- t5 t6 [J]
	qrMul(t5, t5, t6, ec->f, stack);
	// xc <- t1^2 [C]
	qrSqr(ecX(c), t1, ec->f, stack);
	// yc <- t2^2 [D]
	qrSqr(ecY(c, n), t2, ec->f, stack);
	// t6 <- xc + yc [ec->f]
	gf2Add(t6, ecX(c), ecY(c, n), ec->f);
	// zc <- t6 za zb [ec->f * Z1 * Z2]
	qrMul(ecZ(c, n), ecZ(a, n), ecZ(b, n), ec->f, stack);
	qrMul(ecZ(c, n), t6, ecZ(c, n), ec->f, stack);
	// t4 <- t1 (t4 + yc) [A * (H + D)]
	gf2Add2(t4, ecY(c, n), ec->f);
	qrMul(t4, t1, t4, ec->f, stack);
	// xc <- t2 (xc + t3) + t4 [B * (C + G) + A * (H + D)]
	gf2Add2(ecX(c), t3, ec->f);
	qrMul(ecX(c), t2, ecX(c), ec->f, stack);
	gf2Add2(ecX(c), t4, ec->f);
	// t1 <- t1 t5 [A * J]
	qrMul(t1, t1, t5, ec->f, stack);
	// t3 <- t3 t6 [ec->f * G]
	qrMul(t3, t3, t6, ec->f, stack);
	// t1 <- (t1 + t3) t6 [(A * J + ec->f * G) * ec->f]
	gf2Add2(t1, t3, ec->f);
	qrMul(t1, t1, t6, ec->f, stack);
	// yc <- (t5 + zc) xc [(J + Z3) * X3]
	gf2Add(ecY(c, n), t5, ecZ(c, n), ec->f);
	qrMul(ecY(c, n), ecY(c, n), ecX(c), ec->f, stack);
	// yc <- yc + t1 [(A * J + ec->f * G) * ec->f + (J + Z3) * X3]
	gf2Add2(ecY(c, n), t1, ec->f);
}